

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# power.c
# Opt level: O0

int envy_bios_parse_power_unk7c(envy_bios *bios)

{
  int iVar1;
  int iVar2;
  int iVar3;
  envy_bios_power_unk7c *peVar4;
  envy_bios_power_unk7c_entry *peVar5;
  uint32_t data;
  int err;
  int i;
  envy_bios_power_unk7c *unk7c;
  envy_bios *bios_local;
  
  peVar4 = &(bios->power).unk7c;
  if (peVar4->offset == 0) {
    bios_local._4_4_ = -0x16;
  }
  else {
    bios_u8(bios,peVar4->offset,&(bios->power).unk7c.version);
    if ((bios->power).unk7c.version == '\x10') {
      iVar1 = bios_u8(bios,peVar4->offset + 1,&(bios->power).unk7c.hlen);
      iVar2 = bios_u8(bios,peVar4->offset + 2,&(bios->power).unk7c.rlen);
      iVar3 = bios_u8(bios,peVar4->offset + 3,&(bios->power).unk7c.entriesnum);
      (bios->power).unk7c.valid = ((iVar3 != 0 || (iVar2 != 0 || iVar1 != 0)) ^ 0xffU) & 1;
      peVar5 = (envy_bios_power_unk7c_entry *)malloc((ulong)(bios->power).unk7c.entriesnum << 2);
      (bios->power).unk7c.entries = peVar5;
      for (data = 0; (int)data < (int)(uint)(bios->power).unk7c.entriesnum; data = data + 1) {
        (bios->power).unk7c.entries[(int)data].offset =
             peVar4->offset + (uint)(bios->power).unk7c.hlen + data * (bios->power).unk7c.rlen;
      }
      bios_local._4_4_ = 0;
    }
    else {
      fprintf(_stderr,"Unknown LOW POWER PCIe-PLATFORM table version 0x%x\n",
              (ulong)(bios->power).unk7c.version);
      bios_local._4_4_ = -0x16;
    }
  }
  return bios_local._4_4_;
}

Assistant:

int envy_bios_parse_power_unk7c(struct envy_bios *bios) {
	struct envy_bios_power_unk7c *unk7c = &bios->power.unk7c;
	int i, err = 0;

	if (!unk7c->offset)
		return -EINVAL;

	bios_u8(bios, unk7c->offset + 0x0, &unk7c->version);
	switch(unk7c->version) {
	case 0x10:
		err |= bios_u8(bios, unk7c->offset + 0x1, &unk7c->hlen);
		err |= bios_u8(bios, unk7c->offset + 0x2, &unk7c->rlen);
		err |= bios_u8(bios, unk7c->offset + 0x3, &unk7c->entriesnum);
		unk7c->valid = !err;
		break;
	default:
		ENVY_BIOS_ERR("Unknown LOW POWER PCIe-PLATFORM table version 0x%x\n", unk7c->version);
		return -EINVAL;
	};

	err = 0;
	unk7c->entries = malloc(unk7c->entriesnum * sizeof(struct envy_bios_power_unk7c_entry));
	for (i = 0; i < unk7c->entriesnum; i++) {
		uint32_t data = unk7c->offset + unk7c->hlen + i * unk7c->rlen;

		unk7c->entries[i].offset = data;
	}

	return 0;
}